

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

void single_channel_8_to_abgr_f32
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  ALLEGRO_COLOR *pAVar1;
  int iVar2;
  ALLEGRO_COLOR *pAVar3;
  uchar *puVar4;
  ALLEGRO_COLOR AVar5;
  
  puVar4 = (uchar *)((long)src + (long)(sy * src_pitch) + (long)sx);
  pAVar3 = (ALLEGRO_COLOR *)((long)dst + (long)(dy * dst_pitch) + (long)dx * 0x10);
  iVar2 = 0;
  if (height < 1) {
    height = 0;
  }
  for (; iVar2 != height; iVar2 = iVar2 + 1) {
    pAVar1 = pAVar3 + width;
    for (; pAVar3 < pAVar1; pAVar3 = pAVar3 + 1) {
      AVar5 = al_map_rgb(*puVar4,'\0','\0');
      *pAVar3 = AVar5;
      puVar4 = puVar4 + 1;
    }
    puVar4 = puVar4 + (src_pitch - width);
    pAVar3 = pAVar3 + ((long)(dst_pitch / 0x10) - (long)width);
  }
  return;
}

Assistant:

static void single_channel_8_to_abgr_f32(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint8_t *src_ptr = (const uint8_t *)((const char *)src + sy * src_pitch);
   ALLEGRO_COLOR *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 1 - width;
   int dst_gap = dst_pitch / 16 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      ALLEGRO_COLOR *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_SINGLE_CHANNEL_8_TO_ABGR_F32(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}